

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpg.c
# Opt level: O1

void save_jpg_entry_helper(ALLEGRO_FILE *fp,ALLEGRO_BITMAP *bmp,save_jpg_entry_helper_data *data)

{
  char cVar1;
  int iVar2;
  JOCTET *pJVar3;
  undefined8 uVar4;
  char *__nptr;
  ulong uVar5;
  long *plVar6;
  uchar *row [1];
  jpeg_compress_struct cinfo;
  my_err_mgr jerr;
  long local_3f0;
  undefined8 local_3e8;
  undefined8 *local_3e0;
  long local_3c0;
  undefined4 local_3b8;
  uint local_3b4;
  undefined8 local_3b0;
  uint local_294;
  code *local_1a0 [21];
  __jmp_buf_tag local_f8;
  
  data->error = false;
  local_3e8 = jpeg_std_error(local_1a0);
  local_1a0[0] = my_error_exit;
  iVar2 = _setjmp(&local_f8);
  if (iVar2 == 0) {
    pJVar3 = (JOCTET *)
             al_malloc_with_context
                       (0x1000,0x139,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
                        ,"save_jpg_entry_helper");
    data->buffer = pJVar3;
    if (pJVar3 == (JOCTET *)0x0) {
      data->error = true;
    }
    else {
      jpeg_CreateCompress(&local_3e8,0x50,0x248);
      pJVar3 = data->buffer;
      if (local_3c0 == 0) {
        local_3c0 = (*(code *)*local_3e0)(&local_3e8,0,0x38);
      }
      *(code **)(local_3c0 + 0x10) = init_destination;
      *(code **)(local_3c0 + 0x18) = empty_output_buffer;
      *(code **)(local_3c0 + 0x20) = term_destination;
      *(undefined8 *)(local_3c0 + 8) = 0;
      *(JOCTET **)(local_3c0 + 0x28) = pJVar3;
      *(ALLEGRO_FILE **)(local_3c0 + 0x30) = fp;
      local_3b8 = al_get_bitmap_width(bmp);
      local_3b4 = al_get_bitmap_height(bmp);
      local_3b0 = 0x200000003;
      jpeg_set_defaults(&local_3e8);
      uVar4 = al_get_system_config();
      __nptr = (char *)al_get_config_value(uVar4,"image","jpeg_quality_level");
      if (__nptr == (char *)0x0) {
        uVar5 = 0x4b;
      }
      else {
        uVar5 = strtol(__nptr,(char **)0x0,10);
        uVar5 = uVar5 & 0xffffffff;
      }
      jpeg_set_quality(&local_3e8,uVar5,1);
      jpeg_start_compress(&local_3e8,1);
      plVar6 = (long *)al_lock_bitmap(bmp,0x13,1);
      if (local_294 < local_3b4) {
        do {
          local_3f0 = (long)(int)local_294 * (long)*(int *)((long)plVar6 + 0xc) + *plVar6;
          jpeg_write_scanlines(&local_3e8,&local_3f0,1);
        } while (local_294 < local_3b4);
      }
    }
    jpeg_finish_compress(&local_3e8);
  }
  else {
    data->error = true;
  }
  jpeg_destroy_compress(&local_3e8);
  cVar1 = al_is_bitmap_locked(bmp);
  if (cVar1 != '\0') {
    al_unlock_bitmap(bmp);
  }
  al_free_with_context
            (data->buffer,0x167,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/jpg.c"
             ,"save_jpg_entry_helper");
  return;
}

Assistant:

static void save_jpg_entry_helper(ALLEGRO_FILE *fp, ALLEGRO_BITMAP *bmp,
   struct save_jpg_entry_helper_data *data)
{
   struct jpeg_compress_struct cinfo;
   struct my_err_mgr jerr;
   ALLEGRO_LOCKED_REGION *lock;

   data->error = false;

   cinfo.err = jpeg_std_error(&jerr.pub);
   jerr.pub.error_exit = my_error_exit;
   if (setjmp(jerr.jmpenv)) {
      /* Longjmp'd. */
      data->error = true;
      goto longjmp_error;
   }

   data->buffer = al_malloc(BUFFER_SIZE);
   if (!data->buffer) {
      data->error = true;
      goto error;
   }

   jpeg_create_compress(&cinfo);
   jpeg_packfile_dest(&cinfo, fp, data->buffer);

   cinfo.image_width = al_get_bitmap_width(bmp);
   cinfo.image_height = al_get_bitmap_height(bmp);
   cinfo.input_components = 3;
   cinfo.in_color_space = JCS_RGB;
   jpeg_set_defaults(&cinfo);

   const char* level = al_get_config_value(al_get_system_config(), "image", "jpeg_quality_level");
   jpeg_set_quality(&cinfo, level ? strtol(level, NULL, 10) : 75, true);

   jpeg_start_compress(&cinfo, 1);

   /* See comment in load_jpg_entry_helper. */
#ifdef ALLEGRO_BIG_ENDIAN
   lock = al_lock_bitmap(bmp, ALLEGRO_PIXEL_FORMAT_RGB_888,
      ALLEGRO_LOCK_READONLY);
#else
   lock = al_lock_bitmap(bmp, ALLEGRO_PIXEL_FORMAT_BGR_888,
      ALLEGRO_LOCK_READONLY);
#endif

   while (cinfo.next_scanline < cinfo.image_height) {
      unsigned char *row[1];
      row[0] = ((unsigned char *)lock->data)
         + (signed)cinfo.next_scanline * lock->pitch;
      jpeg_write_scanlines(&cinfo, (void *)row, 1);
   }

 error:
   jpeg_finish_compress(&cinfo);

 longjmp_error:
   jpeg_destroy_compress(&cinfo);

   if (al_is_bitmap_locked(bmp)) {
      al_unlock_bitmap(bmp);
   }

   al_free(data->buffer);
}